

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

string * __thiscall
deqp::gls::DrawTestSpec::getDesc_abi_cxx11_(string *__return_storage_ptr__,DrawTestSpec *this)

{
  byte bVar1;
  string *psVar2;
  ostream *poVar3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  pointer pAVar9;
  bool bVar10;
  stringstream desc;
  long *local_228;
  long local_220;
  long local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8 [2];
  allocator<char> local_1e1;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pAVar9 = (this->attribs).
           super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->attribs).
      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar9) {
    lVar8 = 0x25;
    uVar7 = 0;
    do {
      if (*(char *)((long)pAVar9 + lVar8 + -1) == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Attribute ",10);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": default, ",0xb);
        bVar1 = *(byte *)((long)&pAVar9->inputType + lVar8);
        pcVar6 = "color ,";
        if (uVar7 == 0 || (bVar1 & 1) != 0) {
          pcVar6 = "position ,";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,pcVar6,(ulong)((uVar7 == 0 | bVar1) & 1) * 3 + 7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"input datatype ",0xf);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,
                   inputTypeToString::types[*(int *)((long)pAVar9 + lVar8 + -0x25)],
                   (allocator<char> *)&local_228);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_208,local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"input component count ",0x16);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar9 + lVar8 + -0x15));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"used as ",8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,
                   outputTypeToString::types[*(int *)((long)pAVar9 + lVar8 + -0x21)],
                   (allocator<char> *)&local_1e0);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_228,local_220);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Attribute ",10);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        bVar1 = *(byte *)((long)&pAVar9->inputType + lVar8);
        pcVar6 = "color ,";
        if (uVar7 == 0 || (bVar1 & 1) != 0) {
          pcVar6 = "position ,";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,pcVar6,(ulong)((uVar7 == 0 | bVar1) & 1) * 3 + 7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Storage in ",0xb);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,
                   storageToString::storages[*(int *)((long)pAVar9 + lVar8 + -0x1d)],
                   (allocator<char> *)&local_228);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_208,local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"stride ",7);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar9 + lVar8 + -0xd));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"input datatype ",0xf);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,
                   inputTypeToString::types[*(int *)((long)pAVar9 + lVar8 + -0x25)],
                   (allocator<char> *)&local_1e0);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_228,local_220);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"input component count ",0x16);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar9 + lVar8 + -0x15));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        bVar10 = *(char *)((long)pAVar9 + lVar8 + -9) != '\0';
        pcVar6 = "";
        if (bVar10) {
          pcVar6 = "normalized, ";
        }
        lVar5 = 0;
        if (bVar10) {
          lVar5 = 0xc;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"used as ",8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,
                   outputTypeToString::types[*(int *)((long)pAVar9 + lVar8 + -0x21)],&local_1e1);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_1e0,local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"instance divisor ",0x11);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar9 + lVar8 + -5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
      }
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      uVar7 = uVar7 + 1;
      pAVar9 = (this->attribs).
               super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x28;
    } while (uVar7 < (ulong)(((long)(this->attribs).
                                    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar9 >> 3)
                            * -0x3333333333333333));
  }
  psVar2 = local_1c0;
  switch(this->drawMethod) {
  case DRAWMETHOD_DRAWARRAYS:
    poVar3 = local_1a8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"drawArrays(), ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"first ",6);
    piVar4 = &this->first;
    goto LAB_004b86b0;
  case DRAWMETHOD_DRAWARRAYS_INSTANCED:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawArraysInstanced(), ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"first ",6);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->first);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"instance count ",0xf);
    piVar4 = &this->instanceCount;
    goto LAB_004b86b0;
  case DRAWMETHOD_DRAWARRAYS_INDIRECT:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawArraysIndirect(), ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"first ",6);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->first);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"instance count ",0xf);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"indirect offset ",0x10);
    piVar4 = &this->indirectOffset;
LAB_004b86b0:
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    goto switchD_004b82a0_default;
  case DRAWMETHOD_DRAWELEMENTS:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawElements(), ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"index type ",0xb);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,indexTypeToString::indexTypes[(int)this->indexType],
               (allocator<char> *)&local_228);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"index storage in ",0x11);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,storageToString::storages[(int)this->indexStorage],
               (allocator<char> *)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"index offset ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    break;
  case DRAWMETHOD_DRAWELEMENTS_RANGED:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawElementsRanged(), ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"index type ",0xb);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,indexTypeToString::indexTypes[(int)this->indexType],
               (allocator<char> *)&local_228);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"index storage in ",0x11);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,storageToString::storages[(int)this->indexStorage],
               (allocator<char> *)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"index offset ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"range start ",0xc);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"range end ",10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMax);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    break;
  case DRAWMETHOD_DRAWELEMENTS_INSTANCED:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawElementsInstanced(), ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"index type ",0xb);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,indexTypeToString::indexTypes[(int)this->indexType],
               (allocator<char> *)&local_228);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"index storage in ",0x11);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,storageToString::storages[(int)this->indexStorage],
               (allocator<char> *)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"index offset ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"instance count ",0xf);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    break;
  case DRAWMETHOD_DRAWELEMENTS_INDIRECT:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawElementsIndirect(), ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"index type ",0xb);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,indexTypeToString::indexTypes[(int)this->indexType],
               (allocator<char> *)&local_228);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"index storage in ",0x11);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,storageToString::storages[(int)this->indexStorage],
               (allocator<char> *)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"index offset ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"instance count ",0xf);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"indirect offset ",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indirectOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"base vertex ",0xc);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    break;
  default:
    goto switchD_004b82a0_default;
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
switchD_004b82a0_default:
  std::ostream::operator<<(local_1a8,this->primitiveCount);
  uVar7 = (ulong)this->primitive;
  if (uVar7 < 0xb) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)(&DAT_0079b990 + uVar7 * 8),*(long *)(&DAT_00686090 + uVar7 * 8))
    ;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string DrawTestSpec::getDesc (void) const
{
	std::stringstream desc;

	for (size_t ndx = 0; ndx < attribs.size(); ++ndx)
	{
		const AttributeSpec& attrib = attribs[ndx];

		if (attrib.useDefaultAttribute)
		{
			desc
				<< "Attribute " << ndx << ": default, " << ((ndx == 0|| attrib.additionalPositionAttribute) ? ("position ,") : ("color ,"))
				<< "input datatype " << DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << ", "
				<< "input component count " << attrib.componentCount << ", "
				<< "used as " << DrawTestSpec::outputTypeToString(attrib.outputType) << ", ";
		}
		else
		{
			desc
				<< "Attribute " << ndx << ": " << ((ndx == 0|| attrib.additionalPositionAttribute) ? ("position ,") : ("color ,"))
				<< "Storage in " << DrawTestSpec::storageToString(attrib.storage) << ", "
				<< "stride " << attrib.stride << ", "
				<< "input datatype " << DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << ", "
				<< "input component count " << attrib.componentCount << ", "
				<< (attrib.normalize ? "normalized, " : "")
				<< "used as " << DrawTestSpec::outputTypeToString(attrib.outputType) << ", "
				<< "instance divisor " << attrib.instanceDivisor << ", ";
		}
	}

	if (drawMethod == DRAWMETHOD_DRAWARRAYS)
	{
		desc
			<< "drawArrays(), "
			<< "first " << first << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWARRAYS_INSTANCED)
	{
		desc
			<< "drawArraysInstanced(), "
			<< "first " << first << ", "
			<< "instance count " << instanceCount << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS)
	{
		desc
			<< "drawElements(), "
			<< "index type " << DrawTestSpec::indexTypeToString(indexType) << ", "
			<< "index storage in " << DrawTestSpec::storageToString(indexStorage) << ", "
			<< "index offset " << indexPointerOffset << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_RANGED)
	{
		desc
			<< "drawElementsRanged(), "
			<< "index type " << DrawTestSpec::indexTypeToString(indexType) << ", "
			<< "index storage in " << DrawTestSpec::storageToString(indexStorage) << ", "
			<< "index offset " << indexPointerOffset << ", "
			<< "range start " << indexMin << ", "
			<< "range end " << indexMax << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INSTANCED)
	{
		desc
			<< "drawElementsInstanced(), "
			<< "index type " << DrawTestSpec::indexTypeToString(indexType) << ", "
			<< "index storage in " << DrawTestSpec::storageToString(indexStorage) << ", "
			<< "index offset " << indexPointerOffset << ", "
			<< "instance count " << instanceCount << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWARRAYS_INDIRECT)
	{
		desc
			<< "drawArraysIndirect(), "
			<< "first " << first << ", "
			<< "instance count " << instanceCount << ", "
			<< "indirect offset " << indirectOffset << ", ";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT)
	{
		desc
			<< "drawElementsIndirect(), "
			<< "index type " << DrawTestSpec::indexTypeToString(indexType) << ", "
			<< "index storage in " << DrawTestSpec::storageToString(indexStorage) << ", "
			<< "index offset " << indexPointerOffset << ", "
			<< "instance count " << instanceCount << ", "
			<< "indirect offset " << indirectOffset << ", "
			<< "base vertex " << baseVertex << ", ";
	}
	else
		DE_ASSERT(DE_FALSE);

	desc << primitiveCount;

	switch (primitive)
	{
		case DrawTestSpec::PRIMITIVE_POINTS:
			desc << "points";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES:
			desc << "triangles";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_FAN:
			desc << "triangles (fan)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP:
			desc << "triangles (strip)";
			break;
		case DrawTestSpec::PRIMITIVE_LINES:
			desc << "lines";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP:
			desc << "lines (strip)";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_LOOP:
			desc << "lines (loop)";
			break;
		case DrawTestSpec::PRIMITIVE_LINES_ADJACENCY:
			desc << "lines (adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP_ADJACENCY:
			desc << "lines (strip, adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES_ADJACENCY:
			desc << "triangles (adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
			desc << "triangles (strip, adjancency)";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	return desc.str();
}